

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

void __thiscall CRPCCommand::CRPCCommand(CRPCCommand *this,string *category,RpcMethodFnType fn)

{
  Actor *in_RDX;
  string *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  RPCHelpMan *in_stack_fffffffffffffdc8;
  anon_class_8_1_3fcf6586 *in_stack_fffffffffffffdd0;
  intptr_t in_stack_fffffffffffffde0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_fffffffffffffde8;
  string *category_00;
  CRPCCommand *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  RPCHelpMan *in_stack_fffffffffffffe18;
  undefined1 local_1b8 [184];
  undefined1 local_100 [248];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  category_00 = in_RDI;
  std::__cxx11::string::string
            (in_stack_fffffffffffffe10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe08);
  (*(code *)in_RDX)(local_100);
  std::__cxx11::string::string
            (in_stack_fffffffffffffe10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe08);
  std::function<bool(JSONRPCRequest_const&,UniValue&,bool)>::
  function<CRPCCommand::CRPCCommand(std::__cxx11::string,RPCHelpMan(*)())::_lambda(JSONRPCRequest_const&,UniValue&,bool)_1_,void>
            ((function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)> *)in_RDI,
             in_stack_fffffffffffffdd0);
  (*(code *)in_RDX)(local_1b8);
  RPCHelpMan::GetArgNames_abi_cxx11_(in_stack_fffffffffffffe18);
  CRPCCommand(in_stack_fffffffffffffe08,category_00,in_RSI,in_RDX,in_stack_fffffffffffffde8,
              in_stack_fffffffffffffde0);
  ::wallet::_GLOBAL__N_1::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)in_RDI);
  RPCHelpMan::~RPCHelpMan(in_stack_fffffffffffffdc8);
  ::wallet::_GLOBAL__N_1::std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::~function
            ((function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)> *)in_stack_fffffffffffffdc8)
  ;
  std::__cxx11::string::~string(&in_stack_fffffffffffffdc8->m_name);
  RPCHelpMan::~RPCHelpMan(in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffdc8->m_name);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRPCCommand(std::string category, RpcMethodFnType fn)
        : CRPCCommand(
              category,
              fn().m_name,
              [fn](const JSONRPCRequest& request, UniValue& result, bool) { result = fn().HandleRequest(request); return true; },
              fn().GetArgNames(),
              intptr_t(fn))
    {
    }